

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_service_null(t_cpp_generator *this,t_service *tservice,string *style)

{
  t_function *tfunction;
  undefined8 type;
  bool bVar1;
  byte bVar2;
  t_service *ptVar3;
  ostream *poVar4;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar5;
  t_type *type_00;
  undefined8 *puVar6;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  allocator local_401;
  string local_400;
  undefined1 local_3e0 [8];
  t_field returnfield_1;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  allocator local_289;
  string local_288;
  undefined1 local_268 [8];
  t_field returnfield;
  t_type *returntype;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_128;
  t_function **local_120;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_118;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator local_41;
  string local_40 [8];
  string extends;
  string *style_local;
  t_service *tservice_local;
  t_cpp_generator *this_local;
  
  extends.field_2._8_8_ = style;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  ptVar3 = t_service::get_extends(tservice);
  if (ptVar3 != (t_service *)0x0) {
    ptVar3 = t_service::get_extends(tservice);
    type_name_abi_cxx11_(&local_d8,this,&ptVar3->super_t_type,false,false);
    std::operator+(&local_b8," , virtual public ",&local_d8);
    std::operator+(&local_98,&local_b8,style);
    std::operator+(&local_78,&local_98,"Null");
    std::__cxx11::string::operator=(local_40,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  poVar4 = std::operator<<((ostream *)&this->f_header_,"class ");
  poVar4 = std::operator<<(poVar4,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar4 = std::operator<<(poVar4,(string *)style);
  poVar4 = std::operator<<(poVar4,"Null : virtual public ");
  poVar4 = std::operator<<(poVar4,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar4 = std::operator<<(poVar4,(string *)style);
  poVar4 = std::operator<<(poVar4,"If");
  poVar4 = std::operator<<(poVar4,local_40);
  poVar4 = std::operator<<(poVar4," {");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4," public:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)&this->f_header_,
                           (string *)
                           &functions.
                            super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
  poVar4 = std::operator<<(poVar4,"virtual ~");
  poVar4 = std::operator<<(poVar4,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar4 = std::operator<<(poVar4,(string *)style);
  poVar4 = std::operator<<(poVar4,"Null() {}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_118);
  local_120 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  local_118._M_current = local_120;
  do {
    local_128._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=(&local_118,&local_128);
    if (!bVar1) {
      t_generator::indent_down((t_generator *)this);
      poVar4 = std::operator<<((ostream *)&this->f_header_,"};");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
                ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
      std::__cxx11::string::~string(local_40);
      return;
    }
    t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_148);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_118);
    tfunction = *pptVar5;
    std::__cxx11::string::string((string *)&local_188,(string *)style);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a8,"",(allocator *)((long)&returntype + 7));
    function_signature(&local_168,this,tfunction,&local_188,&local_1a8,false);
    poVar4 = std::operator<<(poVar4,(string *)&local_168);
    poVar4 = std::operator<<(poVar4," override {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&returntype + 7));
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_148);
    t_generator::indent_up((t_generator *)this);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_118);
    type_00 = t_function::get_returntype(*pptVar5);
    returnfield._168_8_ = type_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_288,"_return",&local_289);
    t_field::t_field((t_field *)local_268,type_00,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    bVar1 = std::operator==(style,"");
    if (bVar1) {
      bVar2 = (**(code **)(*(long *)returnfield._168_8_ + 0x20))();
      if (((bVar2 & 1) != 0) || (bVar1 = is_complex_type(this,(t_type *)returnfield._168_8_), bVar1)
         ) {
        t_generator::indent_abi_cxx11_(&local_2b0,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_2b0);
        poVar4 = std::operator<<(poVar4,"return;");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_2b0);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_2d0);
        declare_field_abi_cxx11_(&local_2f0,this,(t_field *)local_268,true,false,false,false);
        poVar4 = std::operator<<(poVar4,(string *)&local_2f0);
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
        poVar4 = std::operator<<(poVar4,(string *)&local_310);
        poVar4 = std::operator<<(poVar4,"return _return;");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_2d0);
      }
    }
    else {
      bVar1 = std::operator==(style,"CobSv");
      if (!bVar1) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = "UNKNOWN STYLE";
        __cxa_throw(puVar6,&char_const*::typeinfo,0);
      }
      bVar2 = (**(code **)(*(long *)returnfield._168_8_ + 0x20))();
      type = returnfield._168_8_;
      if ((bVar2 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_400,"_return",&local_401);
        t_field::t_field((t_field *)local_3e0,(t_type *)type,&local_400);
        std::__cxx11::string::~string((string *)&local_400);
        std::allocator<char>::~allocator((allocator<char> *)&local_401);
        t_generator::indent_abi_cxx11_(&local_428,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_428);
        declare_field_abi_cxx11_(&local_448,this,(t_field *)local_3e0,true,false,false,false);
        poVar4 = std::operator<<(poVar4,(string *)&local_448);
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_468,(t_generator *)this);
        poVar4 = std::operator<<(poVar4,(string *)&local_468);
        poVar4 = std::operator<<(poVar4,"return cob(_return);");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_468);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_428);
        t_field::~t_field((t_field *)local_3e0);
      }
      else {
        t_generator::indent_abi_cxx11_((string *)&returnfield_1.reference_,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&returnfield_1.reference_);
        poVar4 = std::operator<<(poVar4,"return cob();");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&returnfield_1.reference_);
      }
    }
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_488,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_488);
    poVar4 = std::operator<<(poVar4,"}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_488);
    t_field::~t_field((t_field *)local_268);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_118);
  } while( true );
}

Assistant:

void t_cpp_generator::generate_service_null(t_service* tservice, string style) {
  string extends = "";
  if (tservice->get_extends() != nullptr) {
    extends = " , virtual public " + type_name(tservice->get_extends()) + style + "Null";
  }
  f_header_ << "class " << service_name_ << style << "Null : virtual public " << service_name_
            << style << "If" << extends << " {" << endl << " public:" << endl;
  indent_up();
  f_header_ << indent() << "virtual ~" << service_name_ << style << "Null() {}" << endl;
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_header_ << indent() << function_signature(*f_iter, style, "", false)
              << " override {" << endl;
    indent_up();

    t_type* returntype = (*f_iter)->get_returntype();
    t_field returnfield(returntype, "_return");

    if (style == "") {
      if (returntype->is_void() || is_complex_type(returntype)) {
        f_header_ << indent() << "return;" << endl;
      } else {
        f_header_ << indent() << declare_field(&returnfield, true) << endl << indent()
                  << "return _return;" << endl;
      }
    } else if (style == "CobSv") {
      if (returntype->is_void()) {
        f_header_ << indent() << "return cob();" << endl;
      } else {
        t_field returnfield(returntype, "_return");
        f_header_ << indent() << declare_field(&returnfield, true) << endl << indent()
                  << "return cob(_return);" << endl;
      }

    } else {
      throw "UNKNOWN STYLE";
    }

    indent_down();
    f_header_ << indent() << "}" << endl;
  }
  indent_down();
  f_header_ << "};" << endl << endl;
}